

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,Script *redeem_script)

{
  long in_RDI;
  
  cfd::core::Script::GetData();
  *(undefined4 *)(in_RDI + 0x18) = 3;
  cfd::core::Pubkey::Pubkey((Pubkey *)(in_RDI + 0x20));
  *(undefined1 *)(in_RDI + 0x38) = 0;
  cfd::core::SigHashType::SigHashType((SigHashType *)(in_RDI + 0x3c));
  cfd::core::ScriptOperator::ScriptOperator
            ((ScriptOperator *)(in_RDI + 0x48),
             (ScriptOperator *)&core::ScriptOperator::OP_INVALIDOPCODE);
  return;
}

Assistant:

SignParameter::SignParameter(const Script& redeem_script)
    : data_(redeem_script.GetData()),
      data_type_(SignDataType::kRedeemScript),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(ScriptOperator::OP_INVALIDOPCODE) {
  // do nothing
}